

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O1

void ompt_pre_init(void)

{
  int iVar1;
  char *target;
  ulong uVar2;
  char *libs;
  
  if (ompt_pre_init::ompt_pre_initialized == '\0') {
    ompt_pre_init::ompt_pre_initialized = 1;
    target = getenv("OMP_TOOL");
    uVar2 = 1;
    if ((target != (char *)0x0) && (*target != '\0')) {
      iVar1 = __kmp_str_match(target,0,"disabled");
      uVar2 = 2;
      if (iVar1 == 0) {
        iVar1 = __kmp_str_match(target,0,"enabled");
        uVar2 = (ulong)((uint)(iVar1 != 0) * 3);
      }
    }
    (*(code *)(&DAT_00181234 + *(int *)(&DAT_00181234 + uVar2 * 4)))();
    return;
  }
  return;
}

Assistant:

void ompt_pre_init() {
  //--------------------------------------------------
  // Execute the pre-initialization logic only once.
  //--------------------------------------------------
  static int ompt_pre_initialized = 0;

  if (ompt_pre_initialized)
    return;

  ompt_pre_initialized = 1;

  //--------------------------------------------------
  // Use a tool iff a tool is enabled and available.
  //--------------------------------------------------
  const char *ompt_env_var = getenv("OMP_TOOL");
  tool_setting_e tool_setting = omp_tool_error;

  if (!ompt_env_var || !strcmp(ompt_env_var, ""))
    tool_setting = omp_tool_unset;
  else if (OMPT_STR_MATCH(ompt_env_var, "disabled"))
    tool_setting = omp_tool_disabled;
  else if (OMPT_STR_MATCH(ompt_env_var, "enabled"))
    tool_setting = omp_tool_enabled;

#if OMPT_DEBUG
  printf("ompt_pre_init(): tool_setting = %d\n", tool_setting);
#endif
  switch (tool_setting) {
  case omp_tool_disabled:
    break;

  case omp_tool_unset:
  case omp_tool_enabled:

    //--------------------------------------------------
    // Load tool iff specified in environment variable
    //--------------------------------------------------
    ompt_start_tool_result =
        ompt_try_start_tool(__kmp_openmp_version, ompt_get_runtime_version());

    memset(&ompt_enabled, 0, sizeof(ompt_enabled));
    break;

  case omp_tool_error:
    fprintf(stderr, "Warning: OMP_TOOL has invalid value \"%s\".\n"
                    "  legal values are (NULL,\"\",\"disabled\","
                    "\"enabled\").\n",
            ompt_env_var);
    break;
  }
#if OMPT_DEBUG
  printf("ompt_pre_init(): ompt_enabled = %d\n", ompt_enabled);
#endif
}